

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

bigint<13> * __thiscall bigint<13>::add<13,13>(bigint<13> *this,bigint<13> *x,bigint<13> *y)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  
  iVar1 = x->len;
  iVar7 = y->len;
  uVar6 = 0;
  uVar4 = 0;
  while (((long)uVar6 < (long)iVar7 || (uVar4 != 0))) {
    uVar3 = 0;
    uVar2 = 0;
    if ((long)uVar6 < (long)iVar1) {
      uVar2 = (uint)x->digits[uVar6];
    }
    if ((long)uVar6 < (long)iVar7) {
      uVar3 = (uint)y->digits[uVar6];
    }
    uVar3 = uVar2 + uVar4 + uVar3;
    this->digits[uVar6] = (digit)uVar3;
    uVar6 = uVar6 + 1;
    uVar4 = uVar3 >> 0x10;
  }
  iVar5 = (int)uVar6;
  if (this != x && iVar5 < iVar1) {
    memcpy(this->digits + (uVar6 & 0xffffffff),x->digits + (uVar6 & 0xffffffff),
           (long)(iVar1 - iVar5) * 2);
  }
  if (iVar7 < iVar1) {
    iVar7 = iVar1;
  }
  if (iVar7 < iVar5) {
    iVar7 = iVar5;
  }
  this->len = iVar7;
  return this;
}

Assistant:

bigint &add(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        dbldigit carry = 0;
        int maxlen = max(x.len, y.len), i;
        for(i = 0; i < y.len || carry; i++)
        {
             carry += (i < x.len ? (dbldigit)x.digits[i] : 0) + (i < y.len ? (dbldigit)y.digits[i] : 0);
             digits[i] = (digit)carry;
             carry >>= BI_DIGIT_BITS;
        }
        if(i < x.len && this != &x) memcpy(&digits[i], &x.digits[i], (x.len - i)*sizeof(digit));
        len = max(i, maxlen);
        return *this;
    }